

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_categs(size_t *ix_arr,int *x,size_t st,size_t end,int ncat,MissingAction missing_action,
               char *categs,size_t *npresent,bool *unsplittable)

{
  ulong uVar1;
  long lVar2;
  
  for (lVar2 = 0; ncat != lVar2; lVar2 = lVar2 + 1) {
    categs[lVar2] = -1;
  }
  for (; st <= end; st = st + 1) {
    if (-1 < (long)x[ix_arr[st]]) {
      categs[x[ix_arr[st]]] = '\x01';
    }
  }
  uVar1 = 0;
  for (lVar2 = 0; ncat != lVar2; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 + ('\0' < categs[lVar2]);
  }
  *npresent = uVar1;
  *unsplittable = uVar1 < 2;
  return;
}

Assistant:

void get_categs(size_t *restrict ix_arr, int x[], size_t st, size_t end, int ncat,
                MissingAction missing_action, signed char categs[], size_t &restrict npresent, bool &unsplittable) noexcept
{
    std::fill(categs, categs + ncat, -1);
    npresent = 0;
    for (size_t row = st; row <= end; row++)
        if (likely(x[ix_arr[row]] >= 0))
            categs[x[ix_arr[row]]] = 1;

    npresent = std::accumulate(categs,
                               categs + ncat,
                               (size_t)0,
                               [](const size_t a, const signed char b){return a + (b > 0);}
                               );

    unsplittable = npresent < 2;
}